

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print_convertable.c
# Opt level: O2

int mpt_print_convertable
              (mpt_convertable *conv,_func_ssize_t_void_ptr_char_ptr_size_t *save,void *dest)

{
  int iVar1;
  uint uVar2;
  ssize_t sVar3;
  ulong uVar4;
  iovec vec;
  mpt_value val;
  uint8_t buf [256];
  
  iVar1 = (*conv->_vptr->convert)(conv,0x43,&vec);
  if (iVar1 < 0) {
    uVar2 = (*conv->_vptr->convert)(conv,0,(void *)0x0);
    if (-1 < (int)uVar2) {
      if (uVar2 < 0x80) {
        uVar4 = (ulong)uVar2;
        uVar2 = (*conv->_vptr->convert)(conv,uVar4,buf);
        if (-1 < (int)uVar2) {
          val._addr = buf;
          val._type = uVar4;
          uVar2 = mpt_print_value(&val,save,dest);
        }
      }
      else {
        uVar2 = 0xfffffffd;
      }
    }
  }
  else {
    sVar3 = (*save)(dest,(char *)vec.iov_base,vec.iov_len);
    uVar2 = (uint)sVar3;
  }
  return uVar2;
}

Assistant:

extern int mpt_print_convertable(MPT_INTERFACE(convertable) *conv, ssize_t (*save)(void *, const char *, size_t), void *dest)
{
	struct iovec vec;
	int type;
	
	/* only default namespace is supported */
	if ((type = conv->_vptr->convert(conv, MPT_type_toVector('c'), &vec)) >= 0) {
		return save(dest, vec.iov_base, vec.iov_len);
	}
	/* get default type of convertable */
	if ((type = conv->_vptr->convert(conv, 0, 0)) < 0) {
		return type;
	}
	/* only core value types are supported */
	if (type < MPT_ENUM(TypeConvertablePtr)) {
		MPT_STRUCT(value) val;
		uint8_t buf[256];
		int ret;
		/* copy data to buffer */
		if ((ret = conv->_vptr->convert(conv, type, buf)) < 0) {
			return ret;
		}
		MPT_value_set(&val, type, buf);
		return mpt_print_value(&val, save, dest);
	}
	return MPT_ERROR(BadType);
}